

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int set_ports_option(mg_context *phys_ctx)

{
  char *pcVar1;
  undefined8 uVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  long lVar6;
  int err;
  long opt_listen_backlog;
  char *opt_txt;
  uint local_b0;
  int portsOk;
  int portsTotal;
  int ip_version;
  socklen_t len;
  usa usa;
  pollfd *pfd;
  socket *ptr;
  socket so;
  vec vec;
  int off;
  int on;
  char *list;
  mg_context *phys_ctx_local;
  
  vec.len._4_4_ = 1;
  vec.len._0_4_ = 0;
  local_b0 = 0;
  opt_txt._4_4_ = 0;
  if (phys_ctx == (mg_context *)0x0) {
    phys_ctx_local._4_4_ = 0;
  }
  else {
    memset(&ptr,0,0x40);
    memset(&ip_version,0,0x1c);
    portsTotal = 0x1c;
    _off = (phys_ctx->dd).config[0];
    while (_off = next_option(_off,(vec *)((long)&so.rsa + 0x18),(vec *)0x0), _off != (char *)0x0) {
      local_b0 = local_b0 + 1;
      iVar3 = parse_port_string((vec *)((long)&so.rsa + 0x18),(socket *)&ptr,&portsOk);
      if (iVar3 == 0) {
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,phys_ctx,"set_ports_option",0x3da1,
                   "%.*s: invalid port spec (entry %i). Expecting list of: %s",
                   (ulong)vec.ptr & 0xffffffff,so._56_8_,local_b0,"[IP_ADDRESS:]PORT[s|r]");
      }
      else {
        iVar3 = 6;
        if (portsOk == 99) {
          iVar3 = 0;
        }
        ptr._0_4_ = socket((uint)ptr._4_2_,1,iVar3);
        if ((int)ptr == -1) {
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,phys_ctx,"set_ports_option",0x3dba,
                     "cannot create socket (entry %i)",(ulong)local_b0);
        }
        else {
          iVar3 = setsockopt((int)ptr,1,2,(void *)((long)&vec.len + 4),4);
          if (iVar3 != 0) {
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,phys_ctx,"set_ports_option",0x3de1,
                       "cannot set socket option SO_REUSEADDR (entry %i)",(ulong)local_b0);
          }
          if (4 < portsOk) {
            if (portsOk < 7) {
              if ((ptr._4_2_ == 10) &&
                 (iVar3 = setsockopt((int)ptr,0x29,0x1a,(void *)((long)&vec.len + 4),4), iVar3 != 0)
                 ) {
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,phys_ctx,"set_ports_option",0x3e0a,
                           "cannot set socket option IPV6_V6ONLY=on (entry %i)",(ulong)local_b0);
              }
            }
            else if ((ptr._4_2_ == 10) &&
                    (iVar3 = setsockopt((int)ptr,0x29,0x1a,&vec.len,4), iVar3 != 0)) {
              mg_cry_internal_wrap
                        ((mg_connection *)0x0,phys_ctx,"set_ports_option",0x3dfb,
                         "cannot set socket option IPV6_V6ONLY=off (entry %i)",(ulong)local_b0);
            }
          }
          if (ptr._4_2_ == 2) {
            portsTotal = 0x10;
            iVar3 = bind((int)ptr,(sockaddr *)((long)&ptr + 4),0x10);
            pcVar1 = vec.ptr;
            uVar2 = so._56_8_;
            if (iVar3 == 0) {
LAB_00124700:
              pcVar1 = (phys_ctx->dd).config[7];
              lVar6 = strtol(pcVar1,(char **)0x0,10);
              if ((lVar6 < 0x80000000) && (0 < lVar6)) {
                iVar3 = listen((int)ptr,(int)lVar6);
                pcVar1 = vec.ptr;
                uVar2 = so._56_8_;
                if (iVar3 == 0) {
                  iVar3 = getsockname((int)ptr,(sockaddr *)&ip_version,(socklen_t *)&portsTotal);
                  if ((iVar3 == 0) && ((ushort)ip_version == ptr._4_2_)) {
                    pfd = (pollfd *)
                          mg_realloc(phys_ctx->listening_sockets,
                                     (ulong)(phys_ctx->num_listening_sockets + 1) << 6);
                    if (pfd == (pollfd *)0x0) {
                      mg_cry_internal_wrap
                                ((mg_connection *)0x0,phys_ctx,"set_ports_option",0x3e88,"%s",
                                 "Out of memory");
                      close((int)ptr);
                      ptr._0_4_ = -1;
                    }
                    else {
                      usa._20_8_ = mg_realloc(phys_ctx->listening_socket_fds,
                                              (ulong)(phys_ctx->num_listening_sockets + 1) << 3);
                      if ((void *)usa._20_8_ == (void *)0x0) {
                        mg_cry_internal_wrap
                                  ((mg_connection *)0x0,phys_ctx,"set_ports_option",0x3e95,"%s",
                                   "Out of memory");
                        close((int)ptr);
                        ptr._0_4_ = -1;
                        mg_free(pfd);
                      }
                      else {
                        set_close_on_exec((int)ptr,(mg_connection *)0x0,phys_ctx);
                        phys_ctx->listening_sockets = (socket *)pfd;
                        memcpy(phys_ctx->listening_sockets + phys_ctx->num_listening_sockets,&ptr,
                               0x40);
                        phys_ctx->listening_socket_fds = (pollfd *)usa._20_8_;
                        phys_ctx->num_listening_sockets = phys_ctx->num_listening_sockets + 1;
                        opt_txt._4_4_ = opt_txt._4_4_ + 1;
                      }
                    }
                  }
                  else {
                    piVar4 = __errno_location();
                    pcVar1 = vec.ptr;
                    uVar2 = so._56_8_;
                    iVar3 = *piVar4;
                    piVar4 = __errno_location();
                    pcVar5 = strerror(*piVar4);
                    mg_cry_internal_wrap
                              ((mg_connection *)0x0,phys_ctx,"set_ports_option",0x3e71,
                               "call to getsockname failed %.*s: %d (%s)",(ulong)pcVar1 & 0xffffffff
                               ,uVar2,iVar3,pcVar5);
                    close((int)ptr);
                    ptr._0_4_ = -1;
                  }
                }
                else {
                  piVar4 = __errno_location();
                  iVar3 = *piVar4;
                  piVar4 = __errno_location();
                  pcVar5 = strerror(*piVar4);
                  mg_cry_internal_wrap
                            ((mg_connection *)0x0,phys_ctx,"set_ports_option",0x3e62,
                             "cannot listen to %.*s: %d (%s)",(ulong)pcVar1 & 0xffffffff,uVar2,iVar3
                             ,pcVar5);
                  close((int)ptr);
                  ptr._0_4_ = -1;
                }
              }
              else {
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,phys_ctx,"set_ports_option",0x3e55,
                           "%s value \"%s\" is invalid","listen_backlog",pcVar1);
                close((int)ptr);
                ptr._0_4_ = -1;
              }
            }
            else {
              piVar4 = __errno_location();
              iVar3 = *piVar4;
              piVar4 = __errno_location();
              pcVar5 = strerror(*piVar4);
              mg_cry_internal_wrap
                        ((mg_connection *)0x0,phys_ctx,"set_ports_option",0x3e1e,
                         "cannot bind to %.*s: %d (%s)",(ulong)pcVar1 & 0xffffffff,uVar2,iVar3,
                         pcVar5);
              close((int)ptr);
              ptr._0_4_ = -1;
            }
          }
          else if (ptr._4_2_ == 10) {
            portsTotal = 0x1c;
            iVar3 = bind((int)ptr,(sockaddr *)((long)&ptr + 4),0x1c);
            pcVar1 = vec.ptr;
            uVar2 = so._56_8_;
            if (iVar3 == 0) goto LAB_00124700;
            piVar4 = __errno_location();
            iVar3 = *piVar4;
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,phys_ctx,"set_ports_option",0x3e2e,
                       "cannot bind to IPv6 %.*s: %d (%s)",(ulong)pcVar1 & 0xffffffff,uVar2,iVar3,
                       pcVar5);
            close((int)ptr);
            ptr._0_4_ = -1;
          }
          else {
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,phys_ctx,"set_ports_option",0x3e49,
                       "cannot bind: address family not supported (entry %i)",(ulong)local_b0);
            close((int)ptr);
            ptr._0_4_ = -1;
          }
        }
      }
    }
    if (opt_txt._4_4_ != local_b0) {
      close_all_listening_sockets(phys_ctx);
      opt_txt._4_4_ = 0;
    }
    phys_ctx_local._4_4_ = opt_txt._4_4_;
  }
  return phys_ctx_local._4_4_;
}

Assistant:

static int
set_ports_option(struct mg_context *phys_ctx)
{
	const char *list;
	int on = 1;
#if defined(USE_IPV6)
	int off = 0;
#endif
	struct vec vec;
	struct socket so, *ptr;

	struct mg_pollfd *pfd;
	union usa usa;
	socklen_t len;
	int ip_version;

	int portsTotal = 0;
	int portsOk = 0;

	const char *opt_txt;
	long opt_listen_backlog;

	if (!phys_ctx) {
		return 0;
	}

	memset(&so, 0, sizeof(so));
	memset(&usa, 0, sizeof(usa));
	len = sizeof(usa);
	list = phys_ctx->dd.config[LISTENING_PORTS];

	while ((list = next_option(list, &vec, NULL)) != NULL) {

		portsTotal++;

		if (!parse_port_string(&vec, &so, &ip_version)) {
			mg_cry_ctx_internal(
			    phys_ctx,
			    "%.*s: invalid port spec (entry %i). Expecting list of: %s",
			    (int)vec.len,
			    vec.ptr,
			    portsTotal,
			    "[IP_ADDRESS:]PORT[s|r]");
			continue;
		}

#if !defined(NO_SSL)
		if (so.is_ssl && phys_ctx->dd.ssl_ctx == NULL) {

			mg_cry_ctx_internal(phys_ctx,
			                    "Cannot add SSL socket (entry %i)",
			                    portsTotal);
			continue;
		}
#endif
		/* Create socket. */
		/* For a list of protocol numbers (e.g., TCP==6) see:
		 * https://www.iana.org/assignments/protocol-numbers/protocol-numbers.xhtml
		 */
		if ((so.sock =
		         socket(so.lsa.sa.sa_family,
		                SOCK_STREAM,
		                (ip_version == 99) ? (/* LOCAL */ 0) : (/* TCP */ 6)))
		    == INVALID_SOCKET) {

			mg_cry_ctx_internal(phys_ctx,
			                    "cannot create socket (entry %i)",
			                    portsTotal);
			continue;
		}

#if defined(_WIN32)
		/* Windows SO_REUSEADDR lets many procs binds to a
		 * socket, SO_EXCLUSIVEADDRUSE makes the bind fail
		 * if someone already has the socket -- DTL */
		/* NOTE: If SO_EXCLUSIVEADDRUSE is used,
		 * Windows might need a few seconds before
		 * the same port can be used again in the
		 * same process, so a short Sleep may be
		 * required between mg_stop and mg_start.
		 */
		if (setsockopt(so.sock,
		               SOL_SOCKET,
		               SO_EXCLUSIVEADDRUSE,
		               (SOCK_OPT_TYPE)&on,
		               sizeof(on))
		    != 0) {

			/* Set reuse option, but don't abort on errors. */
			mg_cry_ctx_internal(
			    phys_ctx,
			    "cannot set socket option SO_EXCLUSIVEADDRUSE (entry %i)",
			    portsTotal);
		}
#else
		if (setsockopt(so.sock,
		               SOL_SOCKET,
		               SO_REUSEADDR,
		               (SOCK_OPT_TYPE)&on,
		               sizeof(on))
		    != 0) {

			/* Set reuse option, but don't abort on errors. */
			mg_cry_ctx_internal(
			    phys_ctx,
			    "cannot set socket option SO_REUSEADDR (entry %i)",
			    portsTotal);
		}
#endif

#if defined(USE_X_DOM_SOCKET)
		if (ip_version == 99) {
			/* Unix domain socket */
		} else
#endif

		    if (ip_version > 4) {
			/* Could be 6 for IPv6 onlyor 10 (4+6) for IPv4+IPv6 */
#if defined(USE_IPV6)
			if (ip_version > 6) {
				if (so.lsa.sa.sa_family == AF_INET6
				    && setsockopt(so.sock,
				                  IPPROTO_IPV6,
				                  IPV6_V6ONLY,
				                  (void *)&off,
				                  sizeof(off))
				           != 0) {

					/* Set IPv6 only option, but don't abort on errors. */
					mg_cry_ctx_internal(phys_ctx,
					                    "cannot set socket option "
					                    "IPV6_V6ONLY=off (entry %i)",
					                    portsTotal);
				}
			} else {
				if (so.lsa.sa.sa_family == AF_INET6
				    && setsockopt(so.sock,
				                  IPPROTO_IPV6,
				                  IPV6_V6ONLY,
				                  (void *)&on,
				                  sizeof(on))
				           != 0) {

					/* Set IPv6 only option, but don't abort on errors. */
					mg_cry_ctx_internal(phys_ctx,
					                    "cannot set socket option "
					                    "IPV6_V6ONLY=on (entry %i)",
					                    portsTotal);
				}
			}
#else
			mg_cry_ctx_internal(phys_ctx, "%s", "IPv6 not available");
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
#endif
		}

		if (so.lsa.sa.sa_family == AF_INET) {

			len = sizeof(so.lsa.sin);
			if (bind(so.sock, &so.lsa.sa, len) != 0) {
				mg_cry_ctx_internal(phys_ctx,
				                    "cannot bind to %.*s: %d (%s)",
				                    (int)vec.len,
				                    vec.ptr,
				                    (int)ERRNO,
				                    strerror(errno));
				closesocket(so.sock);
				so.sock = INVALID_SOCKET;
				continue;
			}
		}
#if defined(USE_IPV6)
		else if (so.lsa.sa.sa_family == AF_INET6) {

			len = sizeof(so.lsa.sin6);
			if (bind(so.sock, &so.lsa.sa, len) != 0) {
				mg_cry_ctx_internal(phys_ctx,
				                    "cannot bind to IPv6 %.*s: %d (%s)",
				                    (int)vec.len,
				                    vec.ptr,
				                    (int)ERRNO,
				                    strerror(errno));
				closesocket(so.sock);
				so.sock = INVALID_SOCKET;
				continue;
			}
		}
#endif
#if defined(USE_X_DOM_SOCKET)
		else if (so.lsa.sa.sa_family == AF_UNIX) {

			len = sizeof(so.lsa.sun);
			if (bind(so.sock, &so.lsa.sa, len) != 0) {
				mg_cry_ctx_internal(phys_ctx,
				                    "cannot bind to unix socket %s: %d (%s)",
				                    so.lsa.sun.sun_path,
				                    (int)ERRNO,
				                    strerror(errno));
				closesocket(so.sock);
				so.sock = INVALID_SOCKET;
				continue;
			}
		}
#endif
		else {
			mg_cry_ctx_internal(
			    phys_ctx,
			    "cannot bind: address family not supported (entry %i)",
			    portsTotal);
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		opt_txt = phys_ctx->dd.config[LISTEN_BACKLOG_SIZE];
		opt_listen_backlog = strtol(opt_txt, NULL, 10);
		if ((opt_listen_backlog > INT_MAX) || (opt_listen_backlog < 1)) {
			mg_cry_ctx_internal(phys_ctx,
			                    "%s value \"%s\" is invalid",
			                    config_options[LISTEN_BACKLOG_SIZE].name,
			                    opt_txt);
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		if (listen(so.sock, (int)opt_listen_backlog) != 0) {

			mg_cry_ctx_internal(phys_ctx,
			                    "cannot listen to %.*s: %d (%s)",
			                    (int)vec.len,
			                    vec.ptr,
			                    (int)ERRNO,
			                    strerror(errno));
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		if ((getsockname(so.sock, &(usa.sa), &len) != 0)
		    || (usa.sa.sa_family != so.lsa.sa.sa_family)) {

			int err = (int)ERRNO;
			mg_cry_ctx_internal(phys_ctx,
			                    "call to getsockname failed %.*s: %d (%s)",
			                    (int)vec.len,
			                    vec.ptr,
			                    err,
			                    strerror(errno));
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		/* Update lsa port in case of random free ports */
#if defined(USE_IPV6)
		if (so.lsa.sa.sa_family == AF_INET6) {
			so.lsa.sin6.sin6_port = usa.sin6.sin6_port;
		} else
#endif
		{
			so.lsa.sin.sin_port = usa.sin.sin_port;
		}

		if ((ptr = (struct socket *)
		         mg_realloc_ctx(phys_ctx->listening_sockets,
		                        (phys_ctx->num_listening_sockets + 1)
		                            * sizeof(phys_ctx->listening_sockets[0]),
		                        phys_ctx))
		    == NULL) {

			mg_cry_ctx_internal(phys_ctx, "%s", "Out of memory");
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		if ((pfd = (struct mg_pollfd *)
		         mg_realloc_ctx(phys_ctx->listening_socket_fds,
		                        (phys_ctx->num_listening_sockets + 1)
		                            * sizeof(phys_ctx->listening_socket_fds[0]),
		                        phys_ctx))
		    == NULL) {

			mg_cry_ctx_internal(phys_ctx, "%s", "Out of memory");
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			mg_free(ptr);
			continue;
		}

		set_close_on_exec(so.sock, NULL, phys_ctx);
		phys_ctx->listening_sockets = ptr;
		phys_ctx->listening_sockets[phys_ctx->num_listening_sockets] = so;
		phys_ctx->listening_socket_fds = pfd;
		phys_ctx->num_listening_sockets++;
		portsOk++;
	}

	if (portsOk != portsTotal) {
		close_all_listening_sockets(phys_ctx);
		portsOk = 0;
	}

	return portsOk;
}